

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O0

void TestDouble_Sign(void)

{
  uint64_t min_double64;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  Double *in_stack_ffffffffffffffd0;
  Double *this;
  int in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffec;
  char *in_stack_fffffffffffffff0;
  
  double_conversion::Double::Double
            (in_stack_ffffffffffffffd0,
             (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  double_conversion::Double::Sign(in_stack_ffffffffffffffd0);
  CheckEqualsHelper(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe0,
                    in_stack_ffffffffffffffdc,(char *)in_stack_ffffffffffffffd0,
                    in_stack_ffffffffffffffcc);
  double_conversion::Double::Infinity();
  double_conversion::Double::Double
            (in_stack_ffffffffffffffd0,
             (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  double_conversion::Double::Sign(in_stack_ffffffffffffffd0);
  CheckEqualsHelper(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe0,
                    in_stack_ffffffffffffffdc,(char *)in_stack_ffffffffffffffd0,
                    in_stack_ffffffffffffffcc);
  double_conversion::Double::Infinity();
  double_conversion::Double::Double
            (in_stack_ffffffffffffffd0,
             (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  double_conversion::Double::Sign(in_stack_ffffffffffffffd0);
  CheckEqualsHelper(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe0,
                    in_stack_ffffffffffffffdc,(char *)in_stack_ffffffffffffffd0,
                    in_stack_ffffffffffffffcc);
  double_conversion::Double::Double
            (in_stack_ffffffffffffffd0,
             (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  double_conversion::Double::Sign(in_stack_ffffffffffffffd0);
  CheckEqualsHelper(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe0,
                    in_stack_ffffffffffffffdc,(char *)in_stack_ffffffffffffffd0,
                    in_stack_ffffffffffffffcc);
  double_conversion::Double::Double
            (in_stack_ffffffffffffffd0,
             (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  double_conversion::Double::Sign(in_stack_ffffffffffffffd0);
  CheckEqualsHelper(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe0,
                    in_stack_ffffffffffffffdc,(char *)in_stack_ffffffffffffffd0,
                    in_stack_ffffffffffffffcc);
  this = (Double *)0x1;
  double_conversion::Double::Double((Double *)&stack0xffffffffffffffc8,1);
  double_conversion::Double::Sign(this);
  CheckEqualsHelper(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe0,
                    in_stack_ffffffffffffffdc,(char *)this,in_stack_ffffffffffffffcc);
  return;
}

Assistant:

TEST(Double_Sign) {
  CHECK_EQ(1, Double(1.0).Sign());
  CHECK_EQ(1, Double(Double::Infinity()).Sign());
  CHECK_EQ(-1, Double(-Double::Infinity()).Sign());
  CHECK_EQ(1, Double(0.0).Sign());
  CHECK_EQ(-1, Double(-0.0).Sign());
  uint64_t min_double64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x00000000, 00000001);
  CHECK_EQ(1, Double(min_double64).Sign());
}